

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON __thiscall JSON::addArrayElement(JSON *this,JSON *val)

{
  element_type *peVar1;
  __uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> _Var2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  runtime_error *this_00;
  value_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  JSON JVar7;
  JSON local_30;
  
  peVar1 = (val->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (_Var2._M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
      super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
           (peVar1->value)._M_t.
           super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t,
     (_Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>)
     _Var2._M_t.super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
     super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl == (JSON_value *)0x0)) {
    lVar5 = 0;
  }
  else {
    lVar5 = __dynamic_cast(_Var2._M_t.
                           super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                           .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,
                           &JSON_value::typeinfo,&JSON_array::typeinfo,0);
  }
  if (lVar5 != 0) {
    if ((in_RDX->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      makeNull();
      std::vector<JSON,_std::allocator<JSON>_>::emplace_back<JSON>
                ((vector<JSON,_std::allocator<JSON>_> *)(lVar5 + 0x10),&local_30);
      _Var6._M_pi = extraout_RDX_00;
      if (local_30.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var6._M_pi = extraout_RDX_01;
      }
    }
    else {
      std::vector<JSON,_std::allocator<JSON>_>::push_back
                ((vector<JSON,_std::allocator<JSON>_> *)(lVar5 + 0x10),in_RDX);
      _Var6._M_pi = extraout_RDX;
    }
    lVar3 = *(long *)(lVar5 + 0x18);
    (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(lVar3 + -0x10);
    p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + -8);
    (this->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var4;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    if (lVar5 != 0) {
      JVar7.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var6._M_pi;
      JVar7.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (JSON)JVar7.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"JSON::addArrayElement called on non-array");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JSON
JSON::addArrayElement(JSON const& val)
{
    if (auto* arr = m ? dynamic_cast<JSON_array*>(m->value.get()) : nullptr) {
        if (val.m) {
            arr->elements.push_back(val);
        } else {
            arr->elements.push_back(makeNull());
        }
        return arr->elements.back();
    }
    throw std::runtime_error("JSON::addArrayElement called on non-array");
    return {}; // unreachable
}